

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O0

_Bool text_needs_bidi(BidiContext *ctx)

{
  _Bool _Var1;
  ulong local_20;
  size_t i;
  BidiContext *ctx_local;
  
  local_20 = 0;
  while( true ) {
    if (ctx->textlen <= local_20) {
      _Var1 = typeIsBidiActive(ctx->paragraphOverride);
      return _Var1;
    }
    _Var1 = typeIsBidiActive(ctx->types[local_20]);
    if (_Var1) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

static bool text_needs_bidi(BidiContext *ctx)
{
    /*
     * Initial optimisation: check for any bidi-active character at
     * all in an input line. If there aren't any, we can skip the
     * whole algorithm.
     *
     * Also include the paragraph override in this check!
     */
    for (size_t i = 0; i < ctx->textlen; i++)
        if (typeIsBidiActive(ctx->types[i]))
            return true;
    return typeIsBidiActive(ctx->paragraphOverride);
}